

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_strglob(char *zGlobPattern,char *zString)

{
  long in_RSI;
  long in_RDI;
  u32 in_stack_00000034;
  compareInfo *in_stack_00000038;
  u8 *in_stack_00000048;
  u8 *in_stack_00000050;
  undefined4 local_4;
  
  if (in_RSI == 0) {
    local_4 = (uint)(in_RDI != 0);
  }
  else if (in_RDI == 0) {
    local_4 = 1;
  }
  else {
    local_4 = patternCompare(in_stack_00000050,in_stack_00000048,in_stack_00000038,in_stack_00000034
                            );
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_strglob(const char *zGlobPattern, const char *zString){
  if( zString==0 ){
    return zGlobPattern!=0;
  }else if( zGlobPattern==0 ){
    return 1;
  }else {
    return patternCompare((u8*)zGlobPattern, (u8*)zString, &globInfo, '[');
  }
}